

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O0

void __thiscall App::draw(App *this,Graphics *g)

{
  int height;
  vec4 color;
  vec4 color_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint currentTimeInMillis;
  int iVar4;
  int currentTimeInMillis_00;
  int iVar5;
  reference this_00;
  reference this_01;
  Rng *pRVar6;
  reference pFVar7;
  char *pcVar8;
  vec<2,_float,_(glm::qualifier)0> *v;
  float extraout_XMM0_Da;
  float _x;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float x;
  float y;
  float extraout_XMM0_Da_02;
  float local_4cc;
  bool local_441;
  bool local_3e9;
  allocator local_399;
  string local_398 [32];
  string local_378 [32];
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_358;
  string local_348 [32];
  undefined8 local_328;
  undefined8 uStack_320;
  string local_318 [32];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  string local_2e8 [32];
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_2c8;
  string local_2b8 [8];
  string str;
  undefined1 auStack_298 [8];
  vec4 cyan;
  vec4 pink;
  float hh;
  float hw;
  const_iterator local_268;
  Firework *local_260;
  __normal_iterator<Firework_*,_std::vector<Firework,_std::allocator<Firework>_>_> local_258;
  __normal_iterator<Firework_*,_std::vector<Firework,_std::allocator<Firework>_>_> local_250;
  iterator it_1;
  Firework *firework_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Firework,_std::allocator<Firework>_> *__range2_1;
  undefined1 local_218 [8];
  Firework firework;
  const_iterator local_1c0;
  Enemy *local_1b8;
  reference local_1b0;
  Enemy *enemy_2;
  __normal_iterator<Enemy_*,_std::vector<Enemy,_std::allocator<Enemy>_>_> local_1a0;
  iterator it;
  Brick *brick;
  iterator __end2;
  iterator __begin2;
  vector<Brick,_std::allocator<Brick>_> *__range2;
  glm local_160 [8];
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_158;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_150;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_148;
  undefined1 local_140 [8];
  Enemy enemy_1;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_b8;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_b0;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_a8;
  undefined1 local_a0 [8];
  Enemy enemy;
  Graphics *g_local;
  App *this_local;
  
  enemy._112_8_ = g;
  if ((this->state != STARTSCREEN) && (this->state != VICTORY)) {
    iVar3 = piksel::BaseApp::millis(&this->super_BaseApp);
    iVar3 = piksel::Timer::getElapsedTimeInMillis(&this->enemySpawnTimer,iVar3);
    if (this->enemySpawnDelayInMillis < iVar3) {
      currentTimeInMillis = piksel::BaseApp::millis(&this->super_BaseApp);
      v = (vec<2,_float,_(glm::qualifier)0> *)(ulong)currentTimeInMillis;
      piksel::Timer::reset(&this->enemySpawnTimer,currentTimeInMillis);
      if ((this->enemySpawnPointToggle & 1U) == 0) {
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_148.field_0,
                   (float)(this->super_BaseApp).width - 8.0,164.0);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_150.field_0,8.0,8.0);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)local_160,1.0,0.0);
        local_158.field_0 =
             (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
              )glm::operator-(local_160,v);
        Enemy::Enemy((Enemy *)local_140,(vec2)local_148,(vec2)local_150,(vec2)local_158.field_0);
        Enemy::setup((Enemy *)local_140,&this->spritesheet);
        std::vector<Enemy,_std::allocator<Enemy>_>::push_back
                  (&this->enemies,(value_type *)local_140);
        Enemy::~Enemy((Enemy *)local_140);
      }
      else {
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_a8.field_0,8.0,164.0);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_b0.field_0,8.0,8.0);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_b8.field_0,1.0,0.0);
        Enemy::Enemy((Enemy *)local_a0,(vec2)local_a8,(vec2)local_b0,(vec2)local_b8);
        Enemy::setup((Enemy *)local_a0,&this->spritesheet);
        std::vector<Enemy,_std::allocator<Enemy>_>::push_back(&this->enemies,(value_type *)local_a0)
        ;
        Enemy::~Enemy((Enemy *)local_a0);
      }
      this->enemySpawnPointToggle = (bool)((this->enemySpawnPointToggle ^ 0xffU) & 1);
    }
  }
  uVar1 = enemy._112_8_;
  glm::vec<4,_float,_(glm::qualifier)0>::vec
            ((vec<4,_float,_(glm::qualifier)0> *)&__range2,0.0,0.0,0.0,1.0);
  piksel::Graphics::background((Graphics *)uVar1,(vec4)___range2);
  piksel::Graphics::noStroke((Graphics *)enemy._112_8_);
  if ((this->state != GAMEOVER) && (this->state != VICTORY)) {
    __end2 = std::vector<Brick,_std::allocator<Brick>_>::begin(&this->bricks);
    brick = (Brick *)std::vector<Brick,_std::allocator<Brick>_>::end(&this->bricks);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Brick_*,_std::vector<Brick,_std::allocator<Brick>_>_>
                                       *)&brick), bVar2) {
      this_00 = __gnu_cxx::__normal_iterator<Brick_*,_std::vector<Brick,_std::allocator<Brick>_>_>::
                operator*(&__end2);
      Brick::draw(this_00,(Graphics *)enemy._112_8_);
      __gnu_cxx::__normal_iterator<Brick_*,_std::vector<Brick,_std::allocator<Brick>_>_>::operator++
                (&__end2);
    }
    it._M_current = *(Enemy **)&(this->mousePos).field_0.field_0;
    Paddle::update(&this->paddle,0x20,(int)((float)(this->super_BaseApp).width + -32.0),
                   (vec2)it._M_current);
    Paddle::draw(&this->paddle,(Graphics *)enemy._112_8_);
  }
  if (this->state != STARTSCREEN) {
    local_1a0._M_current =
         (Enemy *)std::vector<Enemy,_std::allocator<Enemy>_>::begin(&this->enemies);
    while( true ) {
      enemy_2 = (Enemy *)std::vector<Enemy,_std::allocator<Enemy>_>::end(&this->enemies);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1a0,
                         (__normal_iterator<Enemy_*,_std::vector<Enemy,_std::allocator<Enemy>_>_> *)
                         &enemy_2);
      if (!bVar2) break;
      this_01 = __gnu_cxx::__normal_iterator<Enemy_*,_std::vector<Enemy,_std::allocator<Enemy>_>_>::
                operator*(&local_1a0);
      iVar3 = (this->super_BaseApp).width;
      local_1b0 = this_01;
      iVar5 = piksel::BaseApp::millis(&this->super_BaseApp);
      local_3e9 = true;
      if (this->state != VICTORY) {
        local_3e9 = this->state == GAMEOVER;
      }
      Enemy::update(this_01,iVar3,&this->paddle,&this->bricks,&this->character,iVar5,local_3e9);
      iVar3 = Enemy::getTimeOfDeathInMillis(local_1b0);
      if (iVar3 < 0) {
LAB_001631c9:
        bVar2 = Enemy::isOutOfBounds
                          (local_1b0,0,(this->super_BaseApp).width,0x40,(this->super_BaseApp).height
                          );
        if (bVar2) goto LAB_001631f0;
        Enemy::draw(local_1b0,(Graphics *)enemy._112_8_);
        firework.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<Enemy_*,_std::vector<Enemy,_std::allocator<Enemy>_>_>::
                      operator++(&local_1a0,0);
      }
      else {
        iVar3 = piksel::BaseApp::millis(&this->super_BaseApp);
        iVar5 = Enemy::getTimeOfDeathInMillis(local_1b0);
        if (iVar3 - iVar5 < 0xbb9) goto LAB_001631c9;
LAB_001631f0:
        __gnu_cxx::__normal_iterator<Enemy_const*,std::vector<Enemy,std::allocator<Enemy>>>::
        __normal_iterator<Enemy*>
                  ((__normal_iterator<Enemy_const*,std::vector<Enemy,std::allocator<Enemy>>> *)
                   &local_1c0,&local_1a0);
        local_1b8 = (Enemy *)std::vector<Enemy,_std::allocator<Enemy>_>::erase
                                       (&this->enemies,local_1c0);
        local_1a0._M_current = local_1b8;
      }
    }
  }
  if (this->state == VICTORY) {
    piksel::Graphics::push((Graphics *)enemy._112_8_);
    pRVar6 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar6);
    if (extraout_XMM0_Da < 0.1) {
      pRVar6 = piksel::Rng::getInstance();
      piksel::Rng::random(pRVar6);
      glm::vec<2,float,(glm::qualifier)0>::vec<float,int>
                ((vec<2,float,(glm::qualifier)0> *)&__range2_1,_x,(this->super_BaseApp).height);
      Firework::Firework((Firework *)local_218,(vec2)__range2_1);
      std::vector<Firework,_std::allocator<Firework>_>::push_back
                (&this->fireworks,(Firework *)local_218);
      Firework::~Firework((Firework *)local_218);
    }
    __end2_1 = std::vector<Firework,_std::allocator<Firework>_>::begin(&this->fireworks);
    firework_1 = (Firework *)std::vector<Firework,_std::allocator<Firework>_>::end(&this->fireworks)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Firework_*,_std::vector<Firework,_std::allocator<Firework>_>_>
                               *)&firework_1), bVar2) {
      pFVar7 = __gnu_cxx::
               __normal_iterator<Firework_*,_std::vector<Firework,_std::allocator<Firework>_>_>::
               operator*(&__end2_1);
      glm::vec<2,_float,_(glm::qualifier)0>::vec((vec<2,_float,_(glm::qualifier)0> *)&it_1,0.0,0.2);
      Firework::applyForce(pFVar7,(vec2)it_1._M_current);
      Firework::update(pFVar7);
      Firework::draw(pFVar7,(Graphics *)enemy._112_8_);
      __gnu_cxx::__normal_iterator<Firework_*,_std::vector<Firework,_std::allocator<Firework>_>_>::
      operator++(&__end2_1);
    }
    local_250._M_current =
         (Firework *)std::vector<Firework,_std::allocator<Firework>_>::begin(&this->fireworks);
    while( true ) {
      local_258._M_current =
           (Firework *)std::vector<Firework,_std::allocator<Firework>_>::end(&this->fireworks);
      bVar2 = __gnu_cxx::operator!=(&local_250,&local_258);
      if (!bVar2) break;
      pFVar7 = __gnu_cxx::
               __normal_iterator<Firework_*,_std::vector<Firework,_std::allocator<Firework>_>_>::
               operator*(&local_250);
      bVar2 = Firework::isDone(pFVar7);
      if (bVar2) {
        __gnu_cxx::__normal_iterator<Firework_const*,std::vector<Firework,std::allocator<Firework>>>
        ::__normal_iterator<Firework*>
                  ((__normal_iterator<Firework_const*,std::vector<Firework,std::allocator<Firework>>>
                    *)&local_268,&local_250);
        local_260 = (Firework *)
                    std::vector<Firework,_std::allocator<Firework>_>::erase
                              (&this->fireworks,local_268);
        local_250._M_current = local_260;
      }
      else {
        __gnu_cxx::__normal_iterator<Firework_*,_std::vector<Firework,_std::allocator<Firework>_>_>
        ::operator++(&local_250,0);
      }
    }
    piksel::Graphics::pop((Graphics *)enemy._112_8_);
  }
  drawBoundaries(this,(Graphics *)enemy._112_8_);
  iVar3 = (this->super_BaseApp).width;
  iVar5 = (this->super_BaseApp).height;
  iVar4 = piksel::BaseApp::millis(&this->super_BaseApp);
  local_441 = true;
  if (this->state != VICTORY) {
    local_441 = this->state == GAMEOVER;
  }
  Character::update(&this->character,0x20,(int)((float)iVar3 - 32.0),0x40,iVar5,&this->paddle,
                    &this->bricks,iVar4,(this->super_BaseApp).width / 2,local_441);
  Character::draw(&this->character,(Graphics *)enemy._112_8_);
  if (this->state == GAME) {
    iVar3 = (this->super_BaseApp).width;
    iVar5 = (this->super_BaseApp).height;
    iVar4 = (this->super_BaseApp).width;
    height = (this->super_BaseApp).height;
    currentTimeInMillis_00 = piksel::BaseApp::millis(&this->super_BaseApp);
    Ball::update(&this->ball,0x20,(int)((float)iVar3 - 32.0),0x40,iVar5,&this->paddle,&this->bricks,
                 &this->enemySpawnDelayInMillis,iVar4,height,currentTimeInMillis_00);
    Ball::draw(&this->ball,(Graphics *)enemy._112_8_);
  }
  drawScores(this,(Graphics *)enemy._112_8_);
  iVar3 = Character::getLives(&this->character);
  if ((iVar3 < 1) || (iVar3 = Ball::getLives(&this->ball), iVar3 < 1)) {
    this->state = GAMEOVER;
    std::vector<Brick,_std::allocator<Brick>_>::clear(&this->bricks);
  }
  else {
    bVar2 = std::vector<Brick,_std::allocator<Brick>_>::empty(&this->bricks);
    if (bVar2) {
      this->state = VICTORY;
    }
  }
  if (((this->state == STARTSCREEN) || (this->state == GAMEOVER)) || (this->state == VICTORY)) {
    piksel::Graphics::push((Graphics *)enemy._112_8_);
    piksel::Graphics::textSize((Graphics *)enemy._112_8_,42.0);
    if (this->state == STARTSCREEN) {
      pink.field_0.field_0.w = 66.0;
    }
    else if (this->state == GAMEOVER) {
      pink.field_0.field_0.w = 166.0;
    }
    else {
      pink.field_0.field_0.w = 52.0;
    }
    iVar3 = (this->super_BaseApp).height;
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)((long)&cyan.field_0 + 8),1.0,0.0,1.0,1.0);
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)auStack_298,0.0,1.0,1.0,1.0);
    cyan.field_0.field_0.y = 0.5;
    iVar5 = piksel::BaseApp::millis(&this->super_BaseApp);
    iVar5 = piksel::Timer::getElapsedTimeInMillis(&this->glitchTimer,iVar5);
    if (this->glitchDuration < iVar5) {
      if ((this->glitch & 1U) == 0) {
        pRVar6 = piksel::Rng::getInstance();
        piksel::Rng::random(pRVar6);
        this->glitchDuration = (int)extraout_XMM0_Da_01;
      }
      else {
        pRVar6 = piksel::Rng::getInstance();
        piksel::Rng::random(pRVar6);
        this->glitchDuration = (int)extraout_XMM0_Da_00;
      }
      iVar5 = piksel::BaseApp::millis(&this->super_BaseApp);
      piksel::Timer::reset(&this->glitchTimer,iVar5);
      this->glitch = (bool)((this->glitch ^ 0xffU) & 1);
    }
    uVar1 = enemy._112_8_;
    if ((this->glitch & 1U) != 0) {
      pRVar6 = piksel::Rng::getInstance();
      piksel::Rng::random(pRVar6);
      pRVar6 = piksel::Rng::getInstance();
      piksel::Rng::random(pRVar6);
      piksel::Graphics::scale((Graphics *)uVar1,x,y);
    }
    uVar1 = enemy._112_8_;
    if ((this->glitch & 1U) == 0) {
      local_4cc = 0.0;
    }
    else {
      pRVar6 = piksel::Rng::getInstance();
      piksel::Rng::random(pRVar6);
      local_4cc = extraout_XMM0_Da_02;
    }
    piksel::Graphics::translate
              ((Graphics *)uVar1,pink.field_0.field_0.w + local_4cc,(float)(iVar3 / 2 + -0xc));
    std::__cxx11::string::string(local_2b8);
    if (this->state == STARTSCREEN) {
      std::__cxx11::string::operator=(local_2b8,"Mario breaks out");
    }
    else if (this->state == GAMEOVER) {
      std::__cxx11::string::operator=(local_2b8,"GAME OVER");
    }
    else {
      std::__cxx11::string::operator=(local_2b8,"CONGRATULATIONS!");
    }
    uVar1 = enemy._112_8_;
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&local_2c8.field_0,0.0,0.0,0.0,1.0);
    piksel::Graphics::fill((Graphics *)uVar1,(vec4)local_2c8);
    uVar1 = enemy._112_8_;
    std::__cxx11::string::string(local_2e8,local_2b8);
    piksel::Graphics::text((Graphics *)uVar1,(string *)local_2e8,0.0,3.0);
    std::__cxx11::string::~string(local_2e8);
    if ((this->glitch & 1U) != 0) {
      uStack_2f0 = CONCAT44(0x3f000000,pink.field_0.field_0.x);
      local_2f8 = cyan.field_0._8_8_;
      color_00.field_0._8_8_ = uStack_2f0;
      color_00.field_0._0_8_ = cyan.field_0._8_8_;
      piksel::Graphics::fill((Graphics *)enemy._112_8_,color_00);
      uVar1 = enemy._112_8_;
      std::__cxx11::string::string(local_318,local_2b8);
      piksel::Graphics::text((Graphics *)uVar1,(string *)local_318,-3.0,0.0);
      std::__cxx11::string::~string(local_318);
      uStack_320 = CONCAT44(cyan.field_0.field_0.y,cyan.field_0.field_0.x);
      local_328 = auStack_298;
      color.field_0._8_8_ = uStack_320;
      color.field_0._0_8_ = auStack_298;
      piksel::Graphics::fill((Graphics *)enemy._112_8_,color);
      uVar1 = enemy._112_8_;
      std::__cxx11::string::string(local_348,local_2b8);
      piksel::Graphics::text((Graphics *)uVar1,(string *)local_348,3.0,0.0);
      std::__cxx11::string::~string(local_348);
    }
    uVar1 = enemy._112_8_;
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&local_358.field_0,1.0,1.0,1.0,1.0);
    piksel::Graphics::fill((Graphics *)uVar1,(vec4)local_358);
    uVar1 = enemy._112_8_;
    std::__cxx11::string::string(local_378,local_2b8);
    piksel::Graphics::text((Graphics *)uVar1,(string *)local_378,0.0,0.0);
    std::__cxx11::string::~string(local_378);
    piksel::Graphics::pop((Graphics *)enemy._112_8_);
    iVar3 = piksel::Graphics::millis((Graphics *)enemy._112_8_);
    uVar1 = enemy._112_8_;
    if ((int)((long)((ulong)(uint)((int)((long)iVar3 / 1000) >> 0x1f) << 0x20 |
                    (long)iVar3 / 1000 & 0xffffffffU) % 2) == 0) {
      pcVar8 = "PRESS ENTER TO RESTART";
      if (this->state == STARTSCREEN) {
        pcVar8 = "PRESS ENTER TO START";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_398,pcVar8,&local_399);
      iVar3 = 0x69;
      if (this->state == STARTSCREEN) {
        iVar3 = 0x5f;
      }
      piksel::Graphics::text
                ((Graphics *)uVar1,(string *)local_398,
                 (float)((this->super_BaseApp).width / 2 - iVar3),
                 (float)((this->super_BaseApp).height / 2 + 0x2a));
      std::__cxx11::string::~string(local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
    }
    std::__cxx11::string::~string(local_2b8);
  }
  return;
}

Assistant:

void App::draw(piksel::Graphics& g) {
    if (state != STARTSCREEN && state != VICTORY) {
        if (enemySpawnTimer.getElapsedTimeInMillis(millis()) > enemySpawnDelayInMillis) {
            enemySpawnTimer.reset(millis());
            if (enemySpawnPointToggle) {
                Enemy enemy(glm::vec2(ENEMY_WIDTH / 2.0f, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - ENEMY_HEIGHT / 2.0f), glm::vec2(ENEMY_WIDTH / 2.0f, ENEMY_HEIGHT / 2.0f), ENEMY_BASE_VELOCITY);
                enemy.setup(spritesheet);
                enemies.push_back(enemy);
            } else {
                Enemy enemy(glm::vec2(width - ENEMY_WIDTH / 2.0f, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - ENEMY_HEIGHT / 2.0f), glm::vec2(ENEMY_WIDTH / 2.0f, ENEMY_HEIGHT / 2.0f), -ENEMY_BASE_VELOCITY);
                enemy.setup(spritesheet);
                enemies.push_back(enemy);
            }
            enemySpawnPointToggle = !enemySpawnPointToggle;
        }
    }
    g.background(BLACK);
    g.noStroke();
    if (state != GAMEOVER && state != VICTORY) {
        for (Brick& brick : bricks) {
            brick.draw(g);
        }
        paddle.update(BRICK_WIDTH, width - BRICK_WIDTH, mousePos);
        paddle.draw(g);
    }
    if (state != STARTSCREEN) {
        std::vector<Enemy>::iterator it = enemies.begin();
        while (it != enemies.end()) {
            Enemy& enemy = *it;
            enemy.update(width, paddle, bricks, character, millis(), state == VICTORY || state == GAMEOVER);
            if ((enemy.getTimeOfDeathInMillis() > -1 && millis() - enemy.getTimeOfDeathInMillis() > 3000)
                || enemy.isOutOfBounds(0, width, BRICK_WIDTH + BRICK_WIDTH, height)) {
                it = enemies.erase(it);
            } else {
                enemy.draw(g);
                it++;
            }
        }
    }
    if (state == VICTORY) {
        g.push();
        if (piksel::Rng::getInstance().random(0, 1) < 0.1f) {
            Firework firework(glm::vec2(piksel::Rng::getInstance().random(0, width), height));
            fireworks.push_back(firework);
        }
        for (Firework& firework : fireworks) {
            firework.applyForce(GRAVITY);
            firework.update();
            firework.draw(g);
        }
        std::vector<Firework>::iterator it = fireworks.begin();
        while (it != fireworks.end()) {
            if ((*it).isDone()) {
                it = fireworks.erase(it);
            } else {
                it++;
            }
        }
        g.pop();
    }
    drawBoundaries(g);
    character.update(BRICK_WIDTH, width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, height, paddle, bricks, millis(), width / 2, state == VICTORY || state == GAMEOVER);
    character.draw(g);
    if (state == GAME) {
        ball.update(BRICK_WIDTH, width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, height, paddle, bricks, enemySpawnDelayInMillis, width, height, millis());
        ball.draw(g);
    }
    drawScores(g);
    if (character.getLives() <= 0 || ball.getLives() <= 0) {
        state = GAMEOVER;
        bricks.clear();
    } else if (bricks.empty()) {
        state = VICTORY;
    }
    if (state == STARTSCREEN || state == GAMEOVER || state == VICTORY) {
        g.push();

        g.textSize(42);
        float hw;
        switch (state) {
            case STARTSCREEN:
                hw = 66;
                break;
            case GAMEOVER:
                hw = 166;
                break;
            case VICTORY:
            default:
                hw = 52;
                break;
        }
        float hh = height / 2 - 12;
        glm::vec4 pink = PINK;
        pink.a = 0.5;
        glm::vec4 cyan = CYAN;
        cyan.a = 0.5;
        if (glitchTimer.getElapsedTimeInMillis(millis()) > glitchDuration) {
            if (glitch) {
                glitchDuration = int(piksel::Rng::getInstance().random(300, 1500));
            } else {
                glitchDuration = int(piksel::Rng::getInstance().random(150, 300));
            }
            glitchTimer.reset(millis());
            glitch = !glitch;
        }
        if (glitch) {
            g.scale(piksel::Rng::getInstance().random(0.99f, 1.01f), piksel::Rng::getInstance().random(0.99f, 1.01f));
        }
        g.translate(hw + (glitch ? piksel::Rng::getInstance().random(-3.0f, 3.0f) : 0), hh);
        std::string str;
        switch(state) {
            case STARTSCREEN:
                str = "Mario breaks out";
                break;
            case GAMEOVER:
                str = "GAME OVER";
                break;
            case VICTORY:
            default:
                str = "CONGRATULATIONS!";
                break;
        }
        g.fill(BLACK);
        g.text(str, 0, 3);
        if (glitch) {
            g.fill(pink);
            g.text(str, -3, 0);
            g.fill(cyan);
            g.text(str, 3, 0);
        }
        g.fill(WHITE);
        g.text(str, 0, 0);
        g.pop();
        if ((g.millis() / 1000) % 2 == 0) {
            g.text(state == STARTSCREEN ? "PRESS ENTER TO START" : "PRESS ENTER TO RESTART", width / 2 - (state == STARTSCREEN ? 95 : 105), height / 2 + 42);
        }
    }
}